

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * uprv_decNumberLogB_63(decNumber *res,decNumber *rhs,decContext *set)

{
  int iVar1;
  int iVar2;
  uint32_t uin;
  uint32_t uVar3;
  uint32_t status;
  uint32_t local_1c;
  
  local_1c = 0;
  if ((rhs->bits & 0x30) == 0) {
    if ((rhs->bits & 0x40) == 0) {
      if ((rhs->lsu[0] == '\0') && (rhs->digits == 1)) {
        res->bits = '\0';
        res->lsu[0] = '\0';
        res->digits = 1;
        res->exponent = 0;
        res->bits = 0xc0;
        local_1c = 2;
      }
      else {
        iVar1 = rhs->digits;
        iVar2 = rhs->exponent;
        uVar3 = (iVar1 + iVar2) - 1;
        uin = -uVar3;
        if (0 < (int)uVar3) {
          uin = uVar3;
        }
        uprv_decNumberFromUInt32_63(res,uin);
        if (iVar1 + iVar2 < 1) {
          res->bits = 0x80;
        }
      }
    }
    else {
      uprv_decNumberCopy_63(res,rhs);
      res->bits = res->bits & 0x7f;
    }
  }
  else {
    decNaNs(res,rhs,(decNumber *)0x0,set,&local_1c);
  }
  if (local_1c != 0) {
    decStatus(res,local_1c,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberLogB(decNumber *res, const decNumber *rhs,
                          decContext *set) {
  uInt status=0;                   /* accumulator  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* NaNs as usual; Infinities return +Infinity; 0->oops  */
  if (decNumberIsNaN(rhs)) decNaNs(res, rhs, NULL, set, &status);
   else if (decNumberIsInfinite(rhs)) uprv_decNumberCopyAbs(res, rhs);
   else if (decNumberIsZero(rhs)) {
    uprv_decNumberZero(res);                 /* prepare for Infinity  */
    res->bits=DECNEG|DECINF;            /* -Infinity  */
    status|=DEC_Division_by_zero;       /* as per 754  */
    }
   else { /* finite non-zero  */
    Int ae=rhs->exponent+rhs->digits-1; /* adjusted exponent  */
    uprv_decNumberFromInt32(res, ae);        /* lay it out  */
    }

  if (status!=0) decStatus(res, status, set);
  return res;
  }